

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O1

string __thiscall mjs::global_object_impl::common_string(global_object_impl *this,char *str)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  gc_table *pgVar7;
  gc_string *pgVar8;
  gc_table *pgVar9;
  void *pvVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  byte *in_RDX;
  gc_heap *extraout_RDX;
  gc_heap *pgVar14;
  gc_heap *extraout_RDX_00;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  uint32_t uVar18;
  slot *psVar19;
  uint uVar20;
  slot *psVar21;
  bool bVar22;
  string sVar23;
  undefined1 local_70 [16];
  slot *local_60;
  gc_heap *local_58;
  gc_table *local_50;
  gc_table *local_48;
  byte *local_40;
  slot *local_38;
  
  pgVar14 = *(gc_heap **)(str + 8);
  bVar6 = *in_RDX;
  if (bVar6 == 0) {
    uVar15 = 0x811c9dc5;
  }
  else {
    pbVar11 = in_RDX + 1;
    uVar15 = 0x811c9dc5;
    do {
      uVar15 = (uint)bVar6 ^ uVar15 * 0x1000193;
      bVar6 = *pbVar11;
      pbVar11 = pbVar11 + 1;
    } while (bVar6 != 0);
  }
  uVar20 = *(uint *)(str + 0x70);
  uVar17 = uVar20 - 1;
  uVar2 = (pgVar14->alloc_context_).start_;
  if ((uVar2 <= uVar17) && (uVar3 = (pgVar14->alloc_context_).next_free_, uVar17 < uVar3)) {
    psVar19 = (pgVar14->alloc_context_).storage_;
    local_60 = (slot *)this;
    if (gc_type_info_registration<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>>::
        reg._40_4_ != *(int *)((long)psVar19 + (ulong)uVar17 * 8 + 4)) {
      __assert_fail("h.type_check<T>(pos_)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                    ,0x1db,
                    "T &mjs::gc_heap_ptr_untracked<mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>>::dereference(gc_heap &) const [T = mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>, strong = true]"
                   );
    }
    local_58 = pgVar14;
    if ((uVar2 <= uVar20) && (uVar20 < uVar3)) {
      psVar19 = psVar19 + uVar20;
      local_50 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                           ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                            &psVar19->allocation);
      pgVar9 = local_50 + 1;
      pgVar7 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                          &psVar19->allocation);
      uVar18 = pgVar7->length_;
      local_48 = pgVar9;
      if (uVar18 != 0) {
        local_40 = in_RDX + 1;
        uVar20 = 0;
        local_38 = psVar19;
        do {
          psVar19 = local_38;
          pgVar7 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                             ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                              &local_38->allocation);
          if (pgVar7->length_ <= uVar20) {
            __assert_fail("index < tab().length()",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                          ,0x19,
                          "T &mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::operator[](uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
                         );
          }
          pgVar7 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                             ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                              &psVar19->allocation);
          uVar13 = (ulong)uVar20;
          if (*(int *)((long)&pgVar7[1].heap_ + uVar13 * 8 + 4) == 0) {
            pgVar9 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                               ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                                &psVar19->allocation);
            if (pgVar9->capacity_ <= uVar20) {
              __assert_fail("index < capacity()",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                            ,0x87,
                            "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::erase(uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
                           );
            }
            memmove(&pgVar9[1].heap_ + uVar13,&pgVar9[1].capacity_ + uVar13 * 2,
                    (ulong)(~uVar20 + pgVar9->length_) << 3);
            pgVar9->length_ = pgVar9->length_ - 1;
            uVar20 = uVar20 - 1;
            uVar18 = uVar18 - 1;
            pgVar9 = local_48;
          }
          else if (*(uint *)(&pgVar9->heap_ + uVar13) == uVar15) {
            pgVar8 = gc_heap_ptr_untracked<mjs::gc_string,_false>::dereference
                               ((gc_heap_ptr_untracked<mjs::gc_string,_false> *)
                                ((long)&pgVar9->heap_ + uVar13 * 8 + 4),local_58);
            uVar12 = (ulong)pgVar8->length_;
            pbVar11 = in_RDX;
            if (uVar12 != 0) {
              bVar22 = true;
              if (pgVar8[1].length_ == (int)(char)*in_RDX) {
                pbVar11 = local_40 + (pgVar8->length_ - 1);
                uVar16 = 0;
                do {
                  if (uVar12 - 1 == uVar16) goto LAB_0014419c;
                  lVar4 = uVar16 + 1;
                  uVar1 = uVar16 + 1;
                  lVar5 = uVar16 + 2;
                  uVar16 = uVar1;
                } while (pgVar8[lVar5].length_ == (int)(char)in_RDX[lVar4]);
                bVar22 = uVar1 < uVar12;
                pbVar11 = in_RDX + uVar1;
              }
              if (bVar22) goto LAB_001441e7;
            }
LAB_0014419c:
            if (*pbVar11 == 0) {
              if (uVar20 != 0) {
                pgVar14 = (&local_50[1].heap_)[uVar13];
                do {
                  (&local_50[1].heap_)[uVar13] = *(gc_heap **)(&local_50->capacity_ + uVar13 * 2);
                  *(gc_heap **)(&local_50->capacity_ + uVar13 * 2) = pgVar14;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
              gc_heap::unsafe_create_from_position<mjs::gc_string>
                        ((gc_heap *)local_70,(uint32_t)local_58);
              psVar21 = local_60;
              local_60->representation = local_70._0_8_;
              local_60[1].new_position = local_70._8_4_;
              if ((gc_heap *)local_70._0_8_ != (gc_heap *)0x0) {
                gc_heap::attach((gc_heap *)local_70._0_8_,
                                (gc_heap_ptr_untyped *)&local_60->allocation);
              }
              gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_70);
              pgVar14 = extraout_RDX_00;
              goto LAB_00144338;
            }
          }
LAB_001441e7:
          uVar20 = uVar20 + 1;
          psVar19 = local_38;
        } while (uVar20 < uVar18);
      }
      local_70._0_8_ = strlen((char *)in_RDX);
      psVar21 = local_60;
      local_70._8_8_ = in_RDX;
      string::string((string *)&local_60->allocation,local_58,(string_view *)local_70);
      pgVar9 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                          &psVar19->allocation);
      uVar20 = pgVar9->length_;
      pgVar9 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                          &psVar19->allocation);
      if (uVar20 < pgVar9->capacity_) {
        pgVar9 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                           ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                            &psVar19->allocation);
        if (pgVar9->length_ == pgVar9->capacity_) {
          uVar20 = pgVar9->capacity_ * 2;
          if (uVar20 < pgVar9->length_) {
            __assert_fail("new_capacity >= length()",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                          ,0x6a,
                          "gc_heap_ptr<gc_table> mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::copy_with_increased_capacity(uint32_t) const [T = mjs::(anonymous namespace)::string_cache::entry]"
                         );
          }
          gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table::make<>
                    ((gc_table *)local_70,pgVar9->heap_,uVar20);
          pvVar10 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
          if (*(uint *)((long)pvVar10 + 8) < pgVar9->length_) {
            __assert_fail("new_length <= capacity_",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                          ,0x73,
                          "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::length(uint32_t) [T = mjs::(anonymous namespace)::string_cache::entry]"
                         );
          }
          *(uint32_t *)((long)pvVar10 + 0xc) = pgVar9->length_;
          pvVar10 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_70);
          memcpy((void *)((long)pvVar10 + 0x10),pgVar9 + 1,(ulong)pgVar9->length_ << 3);
          psVar19[1].allocation.size = local_70._8_4_;
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_70);
        }
        pgVar9 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                           ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                            &psVar19->allocation);
        uVar20 = pgVar9->length_;
        if (pgVar9->capacity_ <= uVar20) {
          __assert_fail("length() < capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h"
                        ,0x7c,
                        "void mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::push_back(const T &) [T = mjs::(anonymous namespace)::string_cache::entry]"
                       );
        }
        pgVar9->length_ = uVar20 + 1;
        (&pgVar9[1].heap_)[uVar20] = (gc_heap *)0x0;
        pgVar9 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                           ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                            &psVar19->allocation);
        if (local_50 != pgVar9) {
          __assert_fail("es_data == es.data()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                        ,0x1ec,
                        "string mjs::(anonymous namespace)::string_cache::get(gc_heap &, const char *)"
                       );
        }
      }
      pgVar9 = gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::tab
                         ((gc_vector<mjs::(anonymous_namespace)::string_cache::entry> *)
                          &psVar19->allocation);
      uVar20 = pgVar9->length_ - 1;
      pgVar14 = extraout_RDX;
      if (uVar20 != 0) {
        uVar13 = (ulong)uVar20;
        do {
          uVar12 = uVar13 - 1;
          pgVar14 = (&local_48->heap_)[uVar12 & 0xffffffff];
          (&local_48->heap_)[uVar13] = pgVar14;
          uVar13 = uVar12;
        } while ((int)uVar12 != 0);
      }
      local_48->heap_ = (gc_heap *)CONCAT44(psVar21[1].new_position,uVar15);
LAB_00144338:
      sVar23.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = pgVar14;
      sVar23.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)psVar21;
      return (string)sVar23.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
    }
  }
  __assert_fail("pos_inside(pos)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
}

Assistant:

string common_string(const char* str) override {
        return string_cache_.get(heap(), str);
    }